

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::detail::Subcase::~Subcase(Subcase *this)

{
  undefined8 *puVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  IReporter **curr_rep;
  undefined8 *puVar5;
  IReporter **curr_rep_1;
  String local_50;
  undefined1 local_38;
  
  if (this->m_entered == true) {
    if (*(char *)(g_cs + 0x1164) == '\0') {
      std::
      _Rb_tree<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>,std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>,std::_Identity<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>>,std::less<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>>,std::allocator<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>>>
      ::
      _M_insert_unique<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>const&>
                ((_Rb_tree<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>,std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>,std::_Identity<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>>,std::less<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>>,std::allocator<std::vector<doctest::SubcaseSignature,std::allocator<doctest::SubcaseSignature>>>>
                  *)(g_cs + 0x1130),
                 (vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
                 (g_cs + 0x1118));
    }
    std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::pop_back
              ((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
               (g_cs + 0x1118));
    iVar3 = std::uncaught_exceptions();
    lVar4 = g_cs;
    if ((0 < iVar3) && ((*(byte *)(g_cs + 0x1165) & 1) != 0)) {
      puVar1 = *(undefined8 **)(g_cs + 0x10e0);
      for (puVar5 = *(undefined8 **)(g_cs + 0x10d8); lVar4 = g_cs, puVar5 != puVar1;
          puVar5 = puVar5 + 1) {
        plVar2 = (long *)*puVar5;
        String::String(&local_50,
                       "exception thrown in subcase - will translate later when the whole test case has been exited (cannot translate while there is an active exception)"
                      );
        local_38 = 0;
        (**(code **)(*plVar2 + 0x30))(plVar2,&local_50);
        String::~String(&local_50);
      }
      LOCK();
      *(undefined1 *)(g_cs + 0x1165) = 0;
      UNLOCK();
    }
    puVar1 = *(undefined8 **)(lVar4 + 0x10e0);
    for (puVar5 = *(undefined8 **)(lVar4 + 0x10d8); puVar5 != puVar1; puVar5 = puVar5 + 1) {
      (**(code **)(*(long *)*puVar5 + 0x40))();
    }
  }
  String::~String((String *)this);
  return;
}

Assistant:

Subcase::~Subcase() {
        if(m_entered) {
            // only mark the subcase stack as passed if no subcases have been skipped
            if(g_cs->should_reenter == false)
                g_cs->subcasesPassed.insert(g_cs->subcasesStack);
            g_cs->subcasesStack.pop_back();

#if defined(__cpp_lib_uncaught_exceptions) && __cpp_lib_uncaught_exceptions >= 201411L && (!defined(__MAC_OS_X_VERSION_MIN_REQUIRED) || __MAC_OS_X_VERSION_MIN_REQUIRED >= 101200)
            if(std::uncaught_exceptions() > 0
#else
            if(std::uncaught_exception()
#endif
            && g_cs->shouldLogCurrentException) {
                DOCTEST_ITERATE_THROUGH_REPORTERS(
                        test_case_exception, {"exception thrown in subcase - will translate later "
                                              "when the whole test case has been exited (cannot "
                                              "translate while there is an active exception)",
                                              false});
                g_cs->shouldLogCurrentException = false;
            }
            DOCTEST_ITERATE_THROUGH_REPORTERS(subcase_end, DOCTEST_EMPTY);
        }
    }